

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_vectors.h
# Opt level: O0

void __thiscall
Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>::
load_from_file(Vector_distances_in_diagram<Gudhi::Euclidean_distance> *this,char *filename)

{
  byte bVar1;
  bool bVar2;
  ostream *poVar3;
  undefined8 *puVar4;
  long *plVar5;
  double local_238;
  double number;
  istream local_220 [8];
  ifstream in;
  char *filename_local;
  Vector_distances_in_diagram<Gudhi::Euclidean_distance> *this_local;
  
  std::ifstream::ifstream(local_220);
  std::ifstream::open(local_220,filename,8);
  bVar1 = std::ios::good();
  if ((bVar1 & 1) != 0) {
    while( true ) {
      plVar5 = (long *)std::istream::operator>>(local_220,&local_238);
      bVar2 = std::ios::operator_cast_to_bool((ios *)((long)plVar5 + *(long *)(*plVar5 + -0x18)));
      if (!bVar2) break;
      std::vector<double,_std::allocator<double>_>::push_back
                (&this->sorted_vector_of_distances,&local_238);
    }
    std::ifstream::close();
    std::ifstream::~ifstream(local_220);
    return;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"The file : ");
  poVar3 = std::operator<<(poVar3,filename);
  std::operator<<(poVar3," do not exist. The program will now terminate \n");
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = "The persistence landscape file do not exist. The program will now terminate \n";
  __cxa_throw(puVar4,&char_const*::typeinfo,0);
}

Assistant:

void Vector_distances_in_diagram<F>::load_from_file(const char* filename) {
  std::ifstream in;
  in.open(filename);
  // check if the file exist.
  if (!in.good()) {
    std::cerr << "The file : " << filename << " do not exist. The program will now terminate \n";
    throw "The persistence landscape file do not exist. The program will now terminate \n";
  }

  double number;
  while (in >> number) {
    this->sorted_vector_of_distances.push_back(number);
  }
  in.close();
}